

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

file_entry_t * alloc_file_entry(char *prefix,char *path,time_t last_written)

{
  size_t sVar1;
  size_t sVar2;
  file_entry_t *pfVar3;
  
  sVar1 = strlen(prefix);
  sVar2 = strlen(path);
  pfVar3 = (file_entry_t *)malloc(sVar1 + sVar2 + 0x29);
  if (pfVar3 != (file_entry_t *)0x0) {
    strcpy(&pfVar3->field_0x26,prefix);
    strcat(&pfVar3->field_0x26,path);
    pfVar3->next = (file_entry_s *)0x0;
    pfVar3->time_write = last_written;
  }
  return pfVar3;
}

Assistant:

file_entry_t *alloc_file_entry(const char *prefix, const char *path, time_t last_written)
{
	file_entry_t *entry;

	entry = malloc(sizeof(file_entry_t) + strlen(prefix) + strlen(path) + 1);
	if (entry != NULL)
	{
		strcpy(entry->path, prefix);
		strcat(entry->path, path);
		entry->next = NULL;
		entry->time_write = last_written;
	}
	return entry;
}